

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeSavepoint(Btree *p,int op,int iSavepoint)

{
  int *piVar1;
  uint uVar2;
  BtShared *pBt;
  int iVar3;
  Pgno PVar4;
  
  iVar3 = 0;
  if ((p != (Btree *)0x0) && (iVar3 = 0, p->inTrans == '\x02')) {
    pBt = p->pBt;
    if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
      btreeLockCarefully(p);
    }
    iVar3 = 0;
    if ((op == 2) && (iVar3 = 0, pBt->pCursor != (BtCursor *)0x0)) {
      iVar3 = saveCursorsOnList(pBt->pCursor,0,(BtCursor *)0x0);
    }
    if (iVar3 == 0) {
      iVar3 = sqlite3PagerSavepoint(pBt->pPager,op,iSavepoint);
    }
    if (iVar3 == 0) {
      if ((iSavepoint < 0) && ((pBt->btsFlags & 0x10) != 0)) {
        pBt->nPage = 0;
      }
      iVar3 = newDatabase(pBt);
      uVar2 = *(uint *)(pBt->pPage1->aData + 0x1c);
      PVar4 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      if (PVar4 == 0) {
        PVar4 = pBt->pPager->dbSize;
      }
      pBt->nPage = PVar4;
    }
    if (p->sharable != '\0') {
      piVar1 = &p->wantToLock;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        unlockBtreeMutex(p);
      }
    }
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSavepoint(Btree *p, int op, int iSavepoint){
  int rc = SQLITE_OK;
  if( p && p->inTrans==TRANS_WRITE ){
    BtShared *pBt = p->pBt;
    assert( op==SAVEPOINT_RELEASE || op==SAVEPOINT_ROLLBACK );
    assert( iSavepoint>=0 || (iSavepoint==-1 && op==SAVEPOINT_ROLLBACK) );
    sqlite3BtreeEnter(p);
    if( op==SAVEPOINT_ROLLBACK ){
      rc = saveAllCursors(pBt, 0, 0);
    }
    if( rc==SQLITE_OK ){
      rc = sqlite3PagerSavepoint(pBt->pPager, op, iSavepoint);
    }
    if( rc==SQLITE_OK ){
      if( iSavepoint<0 && (pBt->btsFlags & BTS_INITIALLY_EMPTY)!=0 ){
        pBt->nPage = 0;
      }
      rc = newDatabase(pBt);
      btreeSetNPage(pBt, pBt->pPage1);

      /* pBt->nPage might be zero if the database was corrupt when
      ** the transaction was started. Otherwise, it must be at least 1.  */
      assert( CORRUPT_DB || pBt->nPage>0 );
    }
    sqlite3BtreeLeave(p);
  }
  return rc;
}